

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

BlockAddressed * __thiscall
Network::RecvBlock(BlockAddressed *__return_storage_ptr__,Network *this,network_address_t dst)

{
  runtime_error *this_00;
  const_iterator __position;
  list<BlockAddressed,_std::allocator<BlockAddressed>_> *this_01;
  
  std::mutex::lock(&this->_mutex);
  this_01 = &this->_blocks;
  __position._M_node = (_List_node_base *)this_01;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_01) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"no block for you");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  } while (*(int *)((long)&__position._M_node[1]._M_next + 4) != dst);
  BlockAddressed::BlockAddressed(__return_storage_ptr__,(BlockAddressed *)(__position._M_node + 1));
  std::__cxx11::list<BlockAddressed,_std::allocator<BlockAddressed>_>::erase(this_01,__position);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return __return_storage_ptr__;
}

Assistant:

BlockAddressed Network::RecvBlock(network_address_t dst) {
  std::lock_guard<std::mutex> guard(_mutex);
  for (auto it = _blocks.begin(); it !=_blocks.end(); ++it)
  {
    if(it->dst == dst)
    {
      auto bk = *it;
      _blocks.erase(it);
      return bk;
    }
  }
  throw std::runtime_error("no block for you");
}